

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockResult.cxx
# Opt level: O2

string * __thiscall
cmFileLockResult::GetOutputMessage_abi_cxx11_(string *__return_storage_ptr__,cmFileLockResult *this)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch(this->Type) {
  case OK:
    __s = "0";
    __a = &local_9;
    break;
  case SYSTEM:
    __s = strerror(this->ErrorValue);
    __a = &local_a;
    break;
  case TIMEOUT:
    __s = "Timeout reached";
    __a = &local_b;
    break;
  case ALREADY_LOCKED:
    __s = "File already locked";
    __a = &local_c;
    break;
  default:
    __s = "Internal error";
    __a = &local_e;
    break;
  case NO_FUNCTION:
    __s = "\'GUARD FUNCTION\' not used in function definition";
    __a = &local_d;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFileLockResult::GetOutputMessage() const
{
  switch (this->Type) {
    case OK:
      return "0";
    case SYSTEM:
#if defined(_WIN32)
    {
      char winmsg[WINMSG_BUF_LEN];
      DWORD flags = FORMAT_MESSAGE_FROM_SYSTEM | FORMAT_MESSAGE_IGNORE_INSERTS;
      if (FormatMessageA(flags, NULL, this->ErrorValue,
                         MAKELANGID(LANG_NEUTRAL, SUBLANG_DEFAULT),
                         (LPSTR)winmsg, WINMSG_BUF_LEN, NULL)) {
        const std::string message = winmsg;
        return message;
      } else {
        return "Internal error (FormatMessageA failed)";
      }
    }
#else
      return strerror(this->ErrorValue);
#endif
    case TIMEOUT:
      return "Timeout reached";
    case ALREADY_LOCKED:
      return "File already locked";
    case NO_FUNCTION:
      return "'GUARD FUNCTION' not used in function definition";
    case INTERNAL:
    default:
      return "Internal error";
  }
}